

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetProperty(Prim *prim,string *attr_name,Property *out_prop,string *err)

{
  bool bVar1;
  Model *model;
  Xform *xform;
  Scope *scope;
  GeomMesh *mesh;
  GeomSubset *subset;
  Shader *shader;
  Material *material;
  SkelRoot *skelroot;
  BlendShape *blendshape;
  Skeleton *skel;
  SkelAnimation *anim;
  value_type *pvVar2;
  Path *pPVar3;
  string *psVar4;
  string *psVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_2b30 [32];
  string local_2b10;
  ostringstream local_2af0 [8];
  ostringstream ss_e_22;
  string local_2978 [32];
  ostringstream local_2958 [8];
  ostringstream ss_e_21;
  string local_27e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27c0;
  allocator local_2799;
  string local_2798 [32];
  string local_2778;
  ostringstream local_2758 [8];
  ostringstream ss_e_20;
  undefined1 local_25e0 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_10;
  ostringstream local_2598 [8];
  ostringstream ss_e_19;
  string local_2420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2400;
  allocator local_23d9;
  string local_23d8 [32];
  string local_23b8;
  ostringstream local_2398 [8];
  ostringstream ss_e_18;
  undefined1 local_2220 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_9;
  ostringstream local_21d8 [8];
  ostringstream ss_e_17;
  string local_2060 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2040;
  allocator local_2019;
  string local_2018 [32];
  string local_1ff8;
  ostringstream local_1fd8 [8];
  ostringstream ss_e_16;
  undefined1 local_1e60 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_8;
  ostringstream local_1e18 [8];
  ostringstream ss_e_15;
  string local_1ca0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c80;
  allocator local_1c59;
  string local_1c58 [32];
  string local_1c38;
  ostringstream local_1c18 [8];
  ostringstream ss_e_14;
  undefined1 local_1aa0 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_7;
  ostringstream local_1a58 [8];
  ostringstream ss_e_13;
  string local_18e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  allocator local_1899;
  string local_1898 [32];
  string local_1878;
  ostringstream local_1858 [8];
  ostringstream ss_e_12;
  undefined1 local_16e0 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_6;
  ostringstream local_1698 [8];
  ostringstream ss_e_11;
  string local_1520 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1500;
  allocator local_14d9;
  string local_14d8 [32];
  string local_14b8;
  ostringstream local_1498 [8];
  ostringstream ss_e_10;
  undefined1 local_1320 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_5;
  ostringstream local_12d8 [8];
  ostringstream ss_e_9;
  string local_1160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1140;
  allocator local_1119;
  string local_1118 [32];
  string local_10f8;
  ostringstream local_10d8 [8];
  ostringstream ss_e_8;
  undefined1 local_f60 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_4;
  ostringstream local_f18 [8];
  ostringstream ss_e_7;
  string local_da0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  allocator local_d59;
  string local_d58 [32];
  string local_d38;
  ostringstream local_d18 [8];
  ostringstream ss_e_6;
  undefined1 local_ba0 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_3;
  ostringstream local_b58 [8];
  ostringstream ss_e_5;
  string local_9e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  allocator local_999;
  string local_998 [32];
  string local_978;
  ostringstream local_958 [8];
  ostringstream ss_e_4;
  undefined1 local_7e0 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_2;
  ostringstream local_798 [8];
  ostringstream ss_e_3;
  string local_620 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  allocator local_5d9;
  string local_5d8 [32];
  string local_5b8;
  ostringstream local_598 [8];
  ostringstream ss_e_2;
  undefined1 local_420 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_1;
  ostringstream local_3d8 [8];
  ostringstream ss_e_1;
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator local_211;
  string local_210 [32];
  string local_1f0;
  ostringstream local_1d0 [8];
  ostringstream ss_e;
  undefined1 local_58 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string *err_local;
  Property *out_prop_local;
  string *attr_name_local;
  Prim *prim_local;
  
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = err;
  bVar1 = Prim::is<tinyusdz::Model>(prim);
  if (bVar1) {
    model = Prim::as<tinyusdz::Model>(prim);
    anon_unknown_6::GetPrimProperty<tinyusdz::Model>
              ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58,model,attr_name,out_prop);
    bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_58);
    if (bVar1) {
      pvVar2 = nonstd::expected_lite::
               expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_58);
      if ((*pvVar2 & 1U) == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar6 = ::std::operator<<((ostream *)local_1d0,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"GetProperty");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x78f);
        ::std::operator<<(poVar6," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_210,"Attribute `{}` does not exist in Prim {}({})",&local_211);
        pPVar3 = Prim::element_path(prim);
        psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
        tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_1f0,(fmt *)local_210,attr_name,psVar4,&local_238,in_R9);
        poVar6 = ::std::operator<<((ostream *)local_1d0,(string *)&local_1f0);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_238);
        ::std::__cxx11::string::~string(local_210);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
        if (ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=
                    ((string *)
                     ret.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._32_8_,local_258);
          ::std::__cxx11::string::~string(local_258);
        }
        prim_local._7_1_ = 0;
        bVar1 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_1d0);
      }
      else {
        bVar1 = false;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_3d8);
      poVar6 = ::std::operator<<((ostream *)local_3d8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"GetProperty");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x78f);
      ::std::operator<<(poVar6," ");
      psVar5 = (string *)
               nonstd::expected_lite::
               expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_58);
      poVar6 = ::std::operator<<((ostream *)local_3d8,psVar5);
      ::std::operator<<(poVar6,"\n");
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)
                   ret.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._32_8_,(string *)
                           &ret_1.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .m_has_value);
        ::std::__cxx11::string::~string
                  ((string *)
                   &ret_1.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
      }
      prim_local._7_1_ = 0;
      bVar1 = true;
      ::std::__cxx11::ostringstream::~ostringstream(local_3d8);
    }
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_58);
    if (bVar1) goto LAB_0047fcfc;
  }
  else {
    bVar1 = Prim::is<tinyusdz::Xform>(prim);
    if (bVar1) {
      xform = Prim::as<tinyusdz::Xform>(prim);
      anon_unknown_6::GetPrimProperty<tinyusdz::Xform>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_420,xform,attr_name,out_prop);
      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_420);
      if (bVar1) {
        pvVar2 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_420);
        if ((*pvVar2 & 1U) == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_598);
          poVar6 = ::std::operator<<((ostream *)local_598,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"GetProperty");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x790);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_5d8,"Attribute `{}` does not exist in Prim {}({})",&local_5d9);
          pPVar3 = Prim::element_path(prim);
          psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
          tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_5b8,(fmt *)local_5d8,attr_name,psVar4,&local_600,in_R9);
          poVar6 = ::std::operator<<((ostream *)local_598,(string *)&local_5b8);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_5b8);
          ::std::__cxx11::string::~string((string *)&local_600);
          ::std::__cxx11::string::~string(local_5d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
          if (ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=
                      ((string *)
                       ret.contained.
                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._32_8_,local_620);
            ::std::__cxx11::string::~string(local_620);
          }
          prim_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_598);
        }
        else {
          bVar1 = false;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_798);
        poVar6 = ::std::operator<<((ostream *)local_798,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"GetProperty");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x790);
        ::std::operator<<(poVar6," ");
        psVar5 = (string *)
                 nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_420);
        poVar6 = ::std::operator<<((ostream *)local_798,psVar5);
        ::std::operator<<(poVar6,"\n");
        if (ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=
                    ((string *)
                     ret.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._32_8_,(string *)
                             &ret_2.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .m_has_value);
          ::std::__cxx11::string::~string
                    ((string *)
                     &ret_2.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        }
        prim_local._7_1_ = 0;
        bVar1 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_798);
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_420);
      if (bVar1) goto LAB_0047fcfc;
    }
    else {
      bVar1 = Prim::is<tinyusdz::Scope>(prim);
      if (bVar1) {
        scope = Prim::as<tinyusdz::Scope>(prim);
        anon_unknown_6::GetPrimProperty<tinyusdz::Scope>
                  ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_7e0,scope,attr_name,out_prop);
        bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_7e0);
        if (bVar1) {
          pvVar2 = nonstd::expected_lite::
                   expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_7e0);
          if ((*pvVar2 & 1U) == 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_958);
            poVar6 = ::std::operator<<((ostream *)local_958,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"GetProperty");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x791);
            ::std::operator<<(poVar6," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_998,"Attribute `{}` does not exist in Prim {}({})",&local_999);
            pPVar3 = Prim::element_path(prim);
            psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
            tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&local_978,(fmt *)local_998,attr_name,psVar4,&local_9c0,in_R9);
            poVar6 = ::std::operator<<((ostream *)local_958,(string *)&local_978);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::string::~string((string *)&local_978);
            ::std::__cxx11::string::~string((string *)&local_9c0);
            ::std::__cxx11::string::~string(local_998);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_999);
            if (ret.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._32_8_ != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=
                        ((string *)
                         ret.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._32_8_,local_9e0);
              ::std::__cxx11::string::~string(local_9e0);
            }
            prim_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_958);
          }
          else {
            bVar1 = false;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_b58);
          poVar6 = ::std::operator<<((ostream *)local_b58,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"GetProperty");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x791);
          ::std::operator<<(poVar6," ");
          psVar5 = (string *)
                   nonstd::expected_lite::
                   expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_7e0);
          poVar6 = ::std::operator<<((ostream *)local_b58,psVar5);
          ::std::operator<<(poVar6,"\n");
          if (ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=
                      ((string *)
                       ret.contained.
                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._32_8_,(string *)
                               &ret_3.contained.
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .m_has_value);
            ::std::__cxx11::string::~string
                      ((string *)
                       &ret_3.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value);
          }
          prim_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_b58);
        }
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_7e0);
        if (bVar1) goto LAB_0047fcfc;
      }
      else {
        bVar1 = Prim::is<tinyusdz::GeomMesh>(prim);
        if (bVar1) {
          mesh = Prim::as<tinyusdz::GeomMesh>(prim);
          anon_unknown_6::GetPrimProperty<tinyusdz::GeomMesh>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_ba0,mesh,attr_name,out_prop);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_ba0);
          if (bVar1) {
            pvVar2 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_ba0);
            if ((*pvVar2 & 1U) == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_d18);
              poVar6 = ::std::operator<<((ostream *)local_d18,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"GetProperty");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x792);
              ::std::operator<<(poVar6," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_d58,"Attribute `{}` does not exist in Prim {}({})",&local_d59);
              pPVar3 = Prim::element_path(prim);
              psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
              tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (&local_d38,(fmt *)local_d58,attr_name,psVar4,&local_d80,in_R9);
              poVar6 = ::std::operator<<((ostream *)local_d18,(string *)&local_d38);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::string::~string((string *)&local_d38);
              ::std::__cxx11::string::~string((string *)&local_d80);
              ::std::__cxx11::string::~string(local_d58);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_d59);
              if (ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_ != 0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=
                          ((string *)
                           ret.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._32_8_,local_da0);
                ::std::__cxx11::string::~string(local_da0);
              }
              prim_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_d18);
            }
            else {
              bVar1 = false;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_f18);
            poVar6 = ::std::operator<<((ostream *)local_f18,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"GetProperty");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x792);
            ::std::operator<<(poVar6," ");
            psVar5 = (string *)
                     nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_ba0);
            poVar6 = ::std::operator<<((ostream *)local_f18,psVar5);
            ::std::operator<<(poVar6,"\n");
            if (ret.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._32_8_ != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=
                        ((string *)
                         ret.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._32_8_,(string *)
                                 &ret_4.contained.
                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .m_has_value);
              ::std::__cxx11::string::~string
                        ((string *)
                         &ret_4.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
            prim_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_f18);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_ba0);
          if (bVar1) goto LAB_0047fcfc;
        }
        else {
          bVar1 = Prim::is<tinyusdz::GeomSubset>(prim);
          if (bVar1) {
            subset = Prim::as<tinyusdz::GeomSubset>(prim);
            anon_unknown_6::GetPrimProperty<tinyusdz::GeomSubset>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_f60,subset,attr_name,out_prop);
            bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_f60);
            if (bVar1) {
              pvVar2 = nonstd::expected_lite::
                       expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_f60);
              if ((*pvVar2 & 1U) == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_10d8);
                poVar6 = ::std::operator<<((ostream *)local_10d8,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"GetProperty");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x793);
                ::std::operator<<(poVar6," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1118,"Attribute `{}` does not exist in Prim {}({})",&local_1119);
                pPVar3 = Prim::element_path(prim);
                psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                tinyusdz::value::TypeTraits<tinyusdz::GeomSubset>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (&local_10f8,(fmt *)local_1118,attr_name,psVar4,&local_1140,in_R9);
                poVar6 = ::std::operator<<((ostream *)local_10d8,(string *)&local_10f8);
                ::std::operator<<(poVar6,"\n");
                ::std::__cxx11::string::~string((string *)&local_10f8);
                ::std::__cxx11::string::~string((string *)&local_1140);
                ::std::__cxx11::string::~string(local_1118);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1119);
                if (ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_ != 0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=
                            ((string *)
                             ret.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._32_8_,local_1160);
                  ::std::__cxx11::string::~string(local_1160);
                }
                prim_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_10d8);
              }
              else {
                bVar1 = false;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_12d8);
              poVar6 = ::std::operator<<((ostream *)local_12d8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"GetProperty");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x793);
              ::std::operator<<(poVar6," ");
              psVar5 = (string *)
                       nonstd::expected_lite::
                       expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_f60);
              poVar6 = ::std::operator<<((ostream *)local_12d8,psVar5);
              ::std::operator<<(poVar6,"\n");
              if (ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_ != 0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=
                          ((string *)
                           ret.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._32_8_,(string *)
                                   &ret_5.contained.
                                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .m_has_value);
                ::std::__cxx11::string::~string
                          ((string *)
                           &ret_5.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .m_has_value);
              }
              prim_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_12d8);
            }
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_f60);
            if (bVar1) goto LAB_0047fcfc;
          }
          else {
            bVar1 = Prim::is<tinyusdz::Shader>(prim);
            if (bVar1) {
              shader = Prim::as<tinyusdz::Shader>(prim);
              anon_unknown_6::GetPrimProperty<tinyusdz::Shader>
                        ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1320,shader,attr_name,out_prop);
              bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_1320)
              ;
              if (bVar1) {
                pvVar2 = nonstd::expected_lite::
                         expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1320);
                if ((*pvVar2 & 1U) == 0) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1498);
                  poVar6 = ::std::operator<<((ostream *)local_1498,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"GetProperty");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x794);
                  ::std::operator<<(poVar6," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_14d8,"Attribute `{}` does not exist in Prim {}({})",&local_14d9);
                  pPVar3 = Prim::element_path(prim);
                  psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                  tinyusdz::value::TypeTraits<tinyusdz::Shader>::type_name_abi_cxx11_();
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            (&local_14b8,(fmt *)local_14d8,attr_name,psVar4,&local_1500,in_R9);
                  poVar6 = ::std::operator<<((ostream *)local_1498,(string *)&local_14b8);
                  ::std::operator<<(poVar6,"\n");
                  ::std::__cxx11::string::~string((string *)&local_14b8);
                  ::std::__cxx11::string::~string((string *)&local_1500);
                  ::std::__cxx11::string::~string(local_14d8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_14d9);
                  if (ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_8_ != 0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=
                              ((string *)
                               ret.contained.
                               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._32_8_,local_1520);
                    ::std::__cxx11::string::~string(local_1520);
                  }
                  prim_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1498);
                }
                else {
                  bVar1 = false;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1698);
                poVar6 = ::std::operator<<((ostream *)local_1698,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"GetProperty");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x794);
                ::std::operator<<(poVar6," ");
                psVar5 = (string *)
                         nonstd::expected_lite::
                         expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1320);
                poVar6 = ::std::operator<<((ostream *)local_1698,psVar5);
                ::std::operator<<(poVar6,"\n");
                if (ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_ != 0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=
                            ((string *)
                             ret.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._32_8_,(string *)
                                     &ret_6.contained.
                                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .m_has_value);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &ret_6.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .m_has_value);
                }
                prim_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_1698);
              }
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1320);
              if (bVar1) goto LAB_0047fcfc;
            }
            else {
              bVar1 = Prim::is<tinyusdz::Material>(prim);
              if (bVar1) {
                material = Prim::as<tinyusdz::Material>(prim);
                anon_unknown_6::GetPrimProperty<tinyusdz::Material>
                          ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_16e0,material,attr_name,out_prop);
                bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                                  ((expected *)local_16e0);
                if (bVar1) {
                  pvVar2 = nonstd::expected_lite::
                           expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_16e0);
                  if ((*pvVar2 & 1U) == 0) {
                    ::std::__cxx11::ostringstream::ostringstream(local_1858);
                    poVar6 = ::std::operator<<((ostream *)local_1858,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"GetProperty");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x795);
                    ::std::operator<<(poVar6," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1898,"Attribute `{}` does not exist in Prim {}({})",&local_1899
                              );
                    pPVar3 = Prim::element_path(prim);
                    psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                    tinyusdz::value::TypeTraits<tinyusdz::Material>::type_name_abi_cxx11_();
                    fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                              (&local_1878,(fmt *)local_1898,attr_name,psVar4,&local_18c0,in_R9);
                    poVar6 = ::std::operator<<((ostream *)local_1858,(string *)&local_1878);
                    ::std::operator<<(poVar6,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1878);
                    ::std::__cxx11::string::~string((string *)&local_18c0);
                    ::std::__cxx11::string::~string(local_1898);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1899);
                    if (ret.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_ != 0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=
                                ((string *)
                                 ret.contained.
                                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._32_8_,local_18e0);
                      ::std::__cxx11::string::~string(local_18e0);
                    }
                    prim_local._7_1_ = 0;
                    bVar1 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1858);
                  }
                  else {
                    bVar1 = false;
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_1a58);
                  poVar6 = ::std::operator<<((ostream *)local_1a58,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"GetProperty");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x795);
                  ::std::operator<<(poVar6," ");
                  psVar5 = (string *)
                           nonstd::expected_lite::
                           expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_16e0);
                  poVar6 = ::std::operator<<((ostream *)local_1a58,psVar5);
                  ::std::operator<<(poVar6,"\n");
                  if (ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_8_ != 0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=
                              ((string *)
                               ret.contained.
                               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._32_8_,(string *)
                                       &ret_7.contained.
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .m_has_value);
                    ::std::__cxx11::string::~string
                              ((string *)
                               &ret_7.contained.
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .m_has_value);
                  }
                  prim_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1a58);
                }
                nonstd::expected_lite::
                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_16e0);
                if (bVar1) goto LAB_0047fcfc;
              }
              else {
                bVar1 = Prim::is<tinyusdz::SkelRoot>(prim);
                if (bVar1) {
                  skelroot = Prim::as<tinyusdz::SkelRoot>(prim);
                  anon_unknown_6::GetPrimProperty<tinyusdz::SkelRoot>
                            ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1aa0,skelroot,attr_name,out_prop);
                  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                                    ((expected *)local_1aa0);
                  if (bVar1) {
                    pvVar2 = nonstd::expected_lite::
                             expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_1aa0);
                    if ((*pvVar2 & 1U) == 0) {
                      ::std::__cxx11::ostringstream::ostringstream(local_1c18);
                      poVar6 = ::std::operator<<((ostream *)local_1c18,"[error]");
                      poVar6 = ::std::operator<<(poVar6,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                );
                      poVar6 = ::std::operator<<(poVar6,":");
                      poVar6 = ::std::operator<<(poVar6,"GetProperty");
                      poVar6 = ::std::operator<<(poVar6,"():");
                      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x796);
                      ::std::operator<<(poVar6," ");
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_1c58,"Attribute `{}` does not exist in Prim {}({})",
                                 &local_1c59);
                      pPVar3 = Prim::element_path(prim);
                      psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                      tinyusdz::value::TypeTraits<tinyusdz::SkelRoot>::type_name_abi_cxx11_();
                      fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                (&local_1c38,(fmt *)local_1c58,attr_name,psVar4,&local_1c80,in_R9);
                      poVar6 = ::std::operator<<((ostream *)local_1c18,(string *)&local_1c38);
                      ::std::operator<<(poVar6,"\n");
                      ::std::__cxx11::string::~string((string *)&local_1c38);
                      ::std::__cxx11::string::~string((string *)&local_1c80);
                      ::std::__cxx11::string::~string(local_1c58);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_1c59);
                      if (ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_ != 0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::__cxx11::string::operator+=
                                  ((string *)
                                   ret.contained.
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._32_8_,local_1ca0);
                        ::std::__cxx11::string::~string(local_1ca0);
                      }
                      prim_local._7_1_ = 0;
                      bVar1 = true;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1c18);
                    }
                    else {
                      bVar1 = false;
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_1e18);
                    poVar6 = ::std::operator<<((ostream *)local_1e18,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"GetProperty");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x796);
                    ::std::operator<<(poVar6," ");
                    psVar5 = (string *)
                             nonstd::expected_lite::
                             expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_1aa0);
                    poVar6 = ::std::operator<<((ostream *)local_1e18,psVar5);
                    ::std::operator<<(poVar6,"\n");
                    if (ret.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_ != 0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=
                                ((string *)
                                 ret.contained.
                                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._32_8_,(string *)
                                         &ret_8.contained.
                                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          .m_has_value);
                      ::std::__cxx11::string::~string
                                ((string *)
                                 &ret_8.contained.
                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .m_has_value);
                    }
                    prim_local._7_1_ = 0;
                    bVar1 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1e18);
                  }
                  nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_1aa0);
                  if (bVar1) goto LAB_0047fcfc;
                }
                else {
                  bVar1 = Prim::is<tinyusdz::BlendShape>(prim);
                  if (bVar1) {
                    blendshape = Prim::as<tinyusdz::BlendShape>(prim);
                    anon_unknown_6::GetPrimProperty<tinyusdz::BlendShape>
                              ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1e60,blendshape,attr_name,out_prop);
                    bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                                      ((expected *)local_1e60);
                    if (bVar1) {
                      pvVar2 = nonstd::expected_lite::
                               expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_1e60);
                      if ((*pvVar2 & 1U) == 0) {
                        ::std::__cxx11::ostringstream::ostringstream(local_1fd8);
                        poVar6 = ::std::operator<<((ostream *)local_1fd8,"[error]");
                        poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                  );
                        poVar6 = ::std::operator<<(poVar6,":");
                        poVar6 = ::std::operator<<(poVar6,"GetProperty");
                        poVar6 = ::std::operator<<(poVar6,"():");
                        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x797);
                        ::std::operator<<(poVar6," ");
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  (local_2018,"Attribute `{}` does not exist in Prim {}({})",
                                   &local_2019);
                        pPVar3 = Prim::element_path(prim);
                        psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                        tinyusdz::value::TypeTraits<tinyusdz::BlendShape>::type_name_abi_cxx11_();
                        fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                  (&local_1ff8,(fmt *)local_2018,attr_name,psVar4,&local_2040,in_R9)
                        ;
                        poVar6 = ::std::operator<<((ostream *)local_1fd8,(string *)&local_1ff8);
                        ::std::operator<<(poVar6,"\n");
                        ::std::__cxx11::string::~string((string *)&local_1ff8);
                        ::std::__cxx11::string::~string((string *)&local_2040);
                        ::std::__cxx11::string::~string(local_2018);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_2019);
                        if (ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._32_8_ != 0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::__cxx11::string::operator+=
                                    ((string *)
                                     ret.contained.
                                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._32_8_,local_2060);
                          ::std::__cxx11::string::~string(local_2060);
                        }
                        prim_local._7_1_ = 0;
                        bVar1 = true;
                        ::std::__cxx11::ostringstream::~ostringstream(local_1fd8);
                      }
                      else {
                        bVar1 = false;
                      }
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_21d8);
                      poVar6 = ::std::operator<<((ostream *)local_21d8,"[error]");
                      poVar6 = ::std::operator<<(poVar6,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                );
                      poVar6 = ::std::operator<<(poVar6,":");
                      poVar6 = ::std::operator<<(poVar6,"GetProperty");
                      poVar6 = ::std::operator<<(poVar6,"():");
                      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x797);
                      ::std::operator<<(poVar6," ");
                      psVar5 = (string *)
                               nonstd::expected_lite::
                               expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_1e60);
                      poVar6 = ::std::operator<<((ostream *)local_21d8,psVar5);
                      ::std::operator<<(poVar6,"\n");
                      if (ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_ != 0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::__cxx11::string::operator+=
                                  ((string *)
                                   ret.contained.
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._32_8_,(string *)
                                           &ret_9.contained.
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .m_has_value);
                        ::std::__cxx11::string::~string
                                  ((string *)
                                   &ret_9.contained.
                                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .m_has_value);
                      }
                      prim_local._7_1_ = 0;
                      bVar1 = true;
                      ::std::__cxx11::ostringstream::~ostringstream(local_21d8);
                    }
                    nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_1e60);
                    if (bVar1) goto LAB_0047fcfc;
                  }
                  else {
                    bVar1 = Prim::is<tinyusdz::Skeleton>(prim);
                    if (bVar1) {
                      skel = Prim::as<tinyusdz::Skeleton>(prim);
                      anon_unknown_6::GetPrimProperty<tinyusdz::Skeleton>
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_2220,skel,attr_name,out_prop);
                      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                                        ((expected *)local_2220);
                      if (bVar1) {
                        pvVar2 = nonstd::expected_lite::
                                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_2220);
                        if ((*pvVar2 & 1U) == 0) {
                          ::std::__cxx11::ostringstream::ostringstream(local_2398);
                          poVar6 = ::std::operator<<((ostream *)local_2398,"[error]");
                          poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                  );
                          poVar6 = ::std::operator<<(poVar6,":");
                          poVar6 = ::std::operator<<(poVar6,"GetProperty");
                          poVar6 = ::std::operator<<(poVar6,"():");
                          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x798);
                          ::std::operator<<(poVar6," ");
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string
                                    (local_23d8,"Attribute `{}` does not exist in Prim {}({})",
                                     &local_23d9);
                          pPVar3 = Prim::element_path(prim);
                          psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                          tinyusdz::value::TypeTraits<tinyusdz::Skeleton>::type_name_abi_cxx11_();
                          fmt::
                          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                    (&local_23b8,(fmt *)local_23d8,attr_name,psVar4,&local_2400,
                                     in_R9);
                          poVar6 = ::std::operator<<((ostream *)local_2398,(string *)&local_23b8);
                          ::std::operator<<(poVar6,"\n");
                          ::std::__cxx11::string::~string((string *)&local_23b8);
                          ::std::__cxx11::string::~string((string *)&local_2400);
                          ::std::__cxx11::string::~string(local_23d8);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_23d9);
                          if (ret.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._32_8_ != 0) {
                            ::std::__cxx11::ostringstream::str();
                            ::std::__cxx11::string::operator+=
                                      ((string *)
                                       ret.contained.
                                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._32_8_,local_2420);
                            ::std::__cxx11::string::~string(local_2420);
                          }
                          prim_local._7_1_ = 0;
                          bVar1 = true;
                          ::std::__cxx11::ostringstream::~ostringstream(local_2398);
                        }
                        else {
                          bVar1 = false;
                        }
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_2598);
                        poVar6 = ::std::operator<<((ostream *)local_2598,"[error]");
                        poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                  );
                        poVar6 = ::std::operator<<(poVar6,":");
                        poVar6 = ::std::operator<<(poVar6,"GetProperty");
                        poVar6 = ::std::operator<<(poVar6,"():");
                        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x798);
                        ::std::operator<<(poVar6," ");
                        psVar5 = (string *)
                                 nonstd::expected_lite::
                                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_2220);
                        poVar6 = ::std::operator<<((ostream *)local_2598,psVar5);
                        ::std::operator<<(poVar6,"\n");
                        if (ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._32_8_ != 0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::__cxx11::string::operator+=
                                    ((string *)
                                     ret.contained.
                                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._32_8_,(string *)
                                             &ret_10.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .m_has_value);
                          ::std::__cxx11::string::~string
                                    ((string *)
                                     &ret_10.contained.
                                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .m_has_value);
                        }
                        prim_local._7_1_ = 0;
                        bVar1 = true;
                        ::std::__cxx11::ostringstream::~ostringstream(local_2598);
                      }
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2220);
                      if (bVar1) goto LAB_0047fcfc;
                    }
                    else {
                      bVar1 = Prim::is<tinyusdz::SkelAnimation>(prim);
                      if (!bVar1) {
                        ::std::__cxx11::ostringstream::ostringstream(local_2af0);
                        poVar6 = ::std::operator<<((ostream *)local_2af0,"[error]");
                        poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                  );
                        poVar6 = ::std::operator<<(poVar6,":");
                        poVar6 = ::std::operator<<(poVar6,"GetProperty");
                        poVar6 = ::std::operator<<(poVar6,"():");
                        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x79a);
                        ::std::operator<<(poVar6," ");
                        poVar6 = ::std::operator<<((ostream *)local_2af0,"TODO: Prim type ");
                        Prim::type_name_abi_cxx11_(&local_2b10,prim);
                        poVar6 = ::std::operator<<(poVar6,(string *)&local_2b10);
                        ::std::operator<<(poVar6,"\n");
                        ::std::__cxx11::string::~string((string *)&local_2b10);
                        if (ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._32_8_ != 0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::__cxx11::string::operator+=
                                    ((string *)
                                     ret.contained.
                                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._32_8_,local_2b30);
                          ::std::__cxx11::string::~string(local_2b30);
                        }
                        prim_local._7_1_ = 0;
                        ::std::__cxx11::ostringstream::~ostringstream(local_2af0);
                        goto LAB_0047fcfc;
                      }
                      anim = Prim::as<tinyusdz::SkelAnimation>(prim);
                      anon_unknown_6::GetPrimProperty<tinyusdz::SkelAnimation>
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_25e0,anim,attr_name,out_prop);
                      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                                        ((expected *)local_25e0);
                      if (bVar1) {
                        pvVar2 = nonstd::expected_lite::
                                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_25e0);
                        if ((*pvVar2 & 1U) == 0) {
                          ::std::__cxx11::ostringstream::ostringstream(local_2758);
                          poVar6 = ::std::operator<<((ostream *)local_2758,"[error]");
                          poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                  );
                          poVar6 = ::std::operator<<(poVar6,":");
                          poVar6 = ::std::operator<<(poVar6,"GetProperty");
                          poVar6 = ::std::operator<<(poVar6,"():");
                          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x799);
                          ::std::operator<<(poVar6," ");
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string
                                    (local_2798,"Attribute `{}` does not exist in Prim {}({})",
                                     &local_2799);
                          pPVar3 = Prim::element_path(prim);
                          psVar4 = Path::prim_part_abi_cxx11_(pPVar3);
                          tinyusdz::value::TypeTraits<tinyusdz::SkelAnimation>::type_name_abi_cxx11_
                                    ();
                          fmt::
                          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                    (&local_2778,(fmt *)local_2798,attr_name,psVar4,&local_27c0,
                                     in_R9);
                          poVar6 = ::std::operator<<((ostream *)local_2758,(string *)&local_2778);
                          ::std::operator<<(poVar6,"\n");
                          ::std::__cxx11::string::~string((string *)&local_2778);
                          ::std::__cxx11::string::~string((string *)&local_27c0);
                          ::std::__cxx11::string::~string(local_2798);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_2799);
                          if (ret.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._32_8_ != 0) {
                            ::std::__cxx11::ostringstream::str();
                            ::std::__cxx11::string::operator+=
                                      ((string *)
                                       ret.contained.
                                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._32_8_,local_27e0);
                            ::std::__cxx11::string::~string(local_27e0);
                          }
                          prim_local._7_1_ = 0;
                          bVar1 = true;
                          ::std::__cxx11::ostringstream::~ostringstream(local_2758);
                        }
                        else {
                          bVar1 = false;
                        }
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_2958);
                        poVar6 = ::std::operator<<((ostream *)local_2958,"[error]");
                        poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                                  );
                        poVar6 = ::std::operator<<(poVar6,":");
                        poVar6 = ::std::operator<<(poVar6,"GetProperty");
                        poVar6 = ::std::operator<<(poVar6,"():");
                        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x799);
                        ::std::operator<<(poVar6," ");
                        psVar5 = (string *)
                                 nonstd::expected_lite::
                                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_25e0);
                        poVar6 = ::std::operator<<((ostream *)local_2958,psVar5);
                        ::std::operator<<(poVar6,"\n");
                        if (ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._32_8_ != 0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::__cxx11::string::operator+=
                                    ((string *)
                                     ret.contained.
                                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._32_8_,local_2978);
                          ::std::__cxx11::string::~string(local_2978);
                        }
                        prim_local._7_1_ = 0;
                        bVar1 = true;
                        ::std::__cxx11::ostringstream::~ostringstream(local_2958);
                      }
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_25e0);
                      if (bVar1) goto LAB_0047fcfc;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  prim_local._7_1_ = 1;
LAB_0047fcfc:
  return (bool)(prim_local._7_1_ & 1);
}

Assistant:

bool GetProperty(const tinyusdz::Prim &prim, const std::string &attr_name,
                 Property *out_prop, std::string *err) {
#define GET_PRIM_PROPERTY(__ty)                                         \
  if (prim.is<__ty>()) {                                                \
    auto ret = GetPrimProperty(*prim.as<__ty>(), attr_name, out_prop);  \
    if (ret) {                                                          \
      if (!ret.value()) {                                               \
        PUSH_ERROR_AND_RETURN(                                          \
            fmt::format("Attribute `{}` does not exist in Prim {}({})", \
                        attr_name, prim.element_path().prim_part(),     \
                        value::TypeTraits<__ty>::type_name()));         \
      }                                                                 \
    } else {                                                            \
      PUSH_ERROR_AND_RETURN(ret.error());                               \
    }                                                                   \
  } else

  GET_PRIM_PROPERTY(Model)
  GET_PRIM_PROPERTY(Xform)
  GET_PRIM_PROPERTY(Scope)
  GET_PRIM_PROPERTY(GeomMesh)
  GET_PRIM_PROPERTY(GeomSubset)
  GET_PRIM_PROPERTY(Shader)
  GET_PRIM_PROPERTY(Material)
  GET_PRIM_PROPERTY(SkelRoot)
  GET_PRIM_PROPERTY(BlendShape)
  GET_PRIM_PROPERTY(Skeleton)
  GET_PRIM_PROPERTY(SkelAnimation) {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY

  return true;
}